

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParameterErrorsTest::ExpectError
          (GetParameterErrorsTest *this,GLenum expected_error,GLchar *function,GLchar *conditions)

{
  GLenum GVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  GLenum local_38;
  byte local_31;
  GLenum error;
  bool is_ok;
  Functions *gl;
  GLchar *conditions_local;
  GLchar *function_local;
  GetParameterErrorsTest *pGStack_10;
  GLenum expected_error_local;
  GetParameterErrorsTest *this_local;
  
  gl = (Functions *)conditions;
  conditions_local = function;
  function_local._4_4_ = expected_error;
  pGStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  GVar1 = function_local._4_4_;
  _error = CONCAT44(extraout_var,iVar2);
  local_31 = 1;
  local_38 = 0;
  local_38 = (**(code **)(_error + 0x800))();
  if (GVar1 != local_38) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,&conditions_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [27])0x2a6bbe5);
    EVar5 = glu::getErrorStr(function_local._4_4_);
    local_1e8 = EVar5.m_getName;
    local_1e0 = EVar5.m_value;
    local_1d8[0].m_getName = local_1e8;
    local_1d8[0].m_value = local_1e0;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1d8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2a6afaf);
    EVar5 = glu::getErrorStr(local_38);
    local_1f8.m_getName = EVar5.m_getName;
    local_1f8.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [28])" was observed instead when ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char **)&gl);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    local_31 = 0;
  }
  do {
    iVar2 = (**(code **)(_error + 0x800))();
  } while (iVar2 != 0);
  return (bool)(local_31 & 1);
}

Assistant:

bool GetParameterErrorsTest::ExpectError(glw::GLenum expected_error, const glw::GLchar* function,
										 const glw::GLchar* conditions)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function << " was expected to generate "
											<< glu::getErrorStr(expected_error) << ", but " << glu::getErrorStr(error)
											<< " was observed instead when " << conditions << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Clean additional possible errors. */
	while (gl.getError())
		;

	return is_ok;
}